

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
ICM::Function::Signature::checkType
          (Signature *this,vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *argT)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  unsigned_long __n;
  TypeObject *pTVar4;
  const_reference pvVar5;
  Range<unsigned_long> *local_b8;
  unsigned_long i_1;
  RIterator<unsigned_long> __end3;
  RIterator<unsigned_long> __begin3;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> local_78;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *local_68;
  Range<unsigned_long> *__range3;
  unsigned_long i;
  RIterator<unsigned_long> __end2;
  RIterator<unsigned_long> __begin2;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> local_40;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *local_30;
  Range<unsigned_long> *__range2;
  size_t size;
  vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *argT_local;
  Signature *this_local;
  
  size = (size_t)argT;
  argT_local = (vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *)this;
  if ((this->last_is_args & 1U) == 0) {
    sVar2 = std::vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_>::size(argT);
    sVar3 = Common::lightlist<ICM::TypeObject>::size(&this->InType);
    if (sVar2 != sVar3) {
      return false;
    }
  }
  else {
    sVar2 = std::vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_>::size(argT);
    sVar3 = Common::lightlist<ICM::TypeObject>::size(&this->InType);
    if (sVar2 < sVar3) {
      return false;
    }
  }
  if ((this->last_is_args & 1U) == 0) {
    local_b8 = (Range<unsigned_long> *)Common::lightlist<ICM::TypeObject>::size(&this->InType);
  }
  else {
    sVar3 = Common::lightlist<ICM::TypeObject>::size(&this->InType);
    local_b8 = (Range<unsigned_long> *)(sVar3 - 1);
  }
  __range2 = local_b8;
  __begin2.value = 0;
  Common::Range<unsigned_long>::Range
            ((Range<unsigned_long> *)&local_40,&__begin2.value,(unsigned_long *)&__range2);
  local_30 = &local_40;
  __end2 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin(local_30);
  i = (unsigned_long)
      Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end(local_30);
  while (bVar1 = Common::RIterator<unsigned_long>::operator!=
                           (&__end2,(RIterator<unsigned_long> *)&i), bVar1) {
    __range3 = (Range<unsigned_long> *)Common::RIterator<unsigned_long>::operator*(&__end2);
    pTVar4 = Common::lightlist<ICM::TypeObject>::operator[](&this->InType,(size_t)__range3);
    pvVar5 = std::vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_>::operator[]
                       ((vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *)size,
                        (size_type)__range3);
    bVar1 = TypeObject::checkType(pTVar4,pvVar5);
    if (!bVar1) {
      return false;
    }
    Common::RIterator<unsigned_long>::operator++(&__end2);
  }
  if ((this->last_is_args & 1U) != 0) {
    __begin3.value =
         std::vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_>::size
                   ((vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *)size);
    Common::Range<unsigned_long>::Range
              ((Range<unsigned_long> *)&local_78,(unsigned_long *)&__range2,&__begin3.value);
    local_68 = &local_78;
    __end3 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin(local_68);
    i_1 = (unsigned_long)
          Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end(local_68);
    while (bVar1 = Common::RIterator<unsigned_long>::operator!=
                             (&__end3,(RIterator<unsigned_long> *)&i_1), bVar1) {
      __n = Common::RIterator<unsigned_long>::operator*(&__end3);
      pTVar4 = Common::lightlist<ICM::TypeObject>::back(&this->InType);
      pvVar5 = std::vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_>::operator[]
                         ((vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *)size,__n);
      bVar1 = TypeObject::checkType(pTVar4,pvVar5);
      if (!bVar1) {
        return false;
      }
      Common::RIterator<unsigned_long>::operator++(&__end3);
    }
  }
  return true;
}

Assistant:

bool Signature::checkType(const vector<TypeObject> &argT) const {
			// Check Size
			if (last_is_args) {
				if (argT.size() < InType.size())
					return false;
			}
			else if (argT.size() != InType.size()) {
				return false;
			}
			// Check Type
			size_t size = last_is_args ? InType.size() - 1 : InType.size();
			for (auto i : Range<size_t>(0, size))
				if (!InType[i].checkType(argT[i]))
					return false;
			if (last_is_args) {
				for (auto i : Range<size_t>(size, argT.size()))
					if (!InType.back().checkType(argT[i]))
						return false;
			}
			return true;
		}